

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

void Nwk_ObjPrint(Nwk_Obj_t *pObj)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  Nwk_Obj_t *pNStack_18;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pObj_local;
  
  printf("ObjId = %5d.  ",(ulong)(uint)pObj->Id);
  iVar1 = Nwk_ObjIsPi(pObj);
  if (iVar1 != 0) {
    printf("PI");
  }
  iVar1 = Nwk_ObjIsPo(pObj);
  if (iVar1 != 0) {
    printf("PO");
  }
  iVar1 = Nwk_ObjIsNode(pObj);
  if (iVar1 != 0) {
    printf("Node");
  }
  printf("   Fanins = ");
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < pObj->nFanins) {
      pNStack_18 = pObj->pFanio[local_1c];
      bVar2 = pNStack_18 != (Nwk_Obj_t *)0x0;
    }
    if (!bVar2) break;
    printf("%d ",(ulong)(uint)pNStack_18->Id);
    local_1c = local_1c + 1;
  }
  printf("   Fanouts = ");
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if (local_1c < pObj->nFanouts) {
      pNStack_18 = pObj->pFanio[pObj->nFanins + local_1c];
      bVar2 = pNStack_18 != (Nwk_Obj_t *)0x0;
    }
    if (!bVar2) break;
    printf("%d ",(ulong)(uint)pNStack_18->Id);
    local_1c = local_1c + 1;
  }
  printf("\n");
  return;
}

Assistant:

void Nwk_ObjPrint( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    printf( "ObjId = %5d.  ", pObj->Id );
    if ( Nwk_ObjIsPi(pObj) )
        printf( "PI" );
    if ( Nwk_ObjIsPo(pObj) )
        printf( "PO" );
    if ( Nwk_ObjIsNode(pObj) )
        printf( "Node" );
    printf( "   Fanins = " );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        printf( "%d ", pNext->Id );
    printf( "   Fanouts = " );
    Nwk_ObjForEachFanout( pObj, pNext, i )
        printf( "%d ", pNext->Id );
    printf( "\n" );
}